

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O1

uchar * Gia_AigerWriteMappingInt(Gia_Man_t *p,int *pMapSize)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uchar *puVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uchar *puVar8;
  ulong uVar9;
  int iVar10;
  size_t __size;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  ulong uVar18;
  
  pVVar2 = p->vMapping;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                  ,0xae,"unsigned char *Gia_AigerWriteMappingInt(Gia_Man_t *, int *)");
  }
  iVar5 = p->nObjs;
  uVar18 = (ulong)iVar5;
  __size = 4;
  if (1 < (long)uVar18) {
    uVar1 = pVVar2->nSize;
    uVar6 = 1;
    if (1 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    iVar7 = 0;
    uVar12 = 1;
    do {
      if (uVar6 == uVar12) goto LAB_0064b76d;
      uVar16 = pVVar2->pArray[uVar12];
      if ((ulong)uVar16 != 0) {
        if (((int)uVar16 < 0) || ((int)uVar1 <= (int)uVar16)) goto LAB_0064b76d;
        iVar7 = iVar7 + pVVar2->pArray[uVar16] + 2;
      }
      uVar12 = uVar12 + 1;
    } while (uVar18 != uVar12);
    __size = (long)iVar7 * 4 + 4;
  }
  puVar4 = (uchar *)malloc(__size);
  iVar7 = 4;
  if (1 < iVar5) {
    uVar1 = pVVar2->nSize;
    uVar6 = 1;
    if (1 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    iVar5 = 0;
    iVar7 = 4;
    uVar12 = 1;
    do {
      if (uVar12 == uVar6) {
LAB_0064b76d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = pVVar2->pArray;
      uVar16 = piVar3[uVar12];
      uVar11 = (ulong)uVar16;
      if (uVar11 != 0) {
        if (((int)uVar16 < 0) || ((int)uVar1 <= (int)uVar16)) goto LAB_0064b76d;
        uVar16 = piVar3[uVar11];
        uVar13 = (ulong)uVar16;
        uVar14 = uVar13;
        if (0x7f < uVar13) {
          pbVar17 = puVar4 + iVar7;
          do {
            uVar15 = (uint)uVar14;
            *pbVar17 = (byte)uVar14 | 0x80;
            uVar14 = uVar14 >> 7;
            pbVar17 = pbVar17 + 1;
            iVar7 = iVar7 + 1;
          } while (0x3fff < uVar15);
        }
        puVar4[iVar7] = (uchar)uVar14;
        iVar7 = iVar7 + 1;
        if (0 < (int)uVar16) {
          uVar14 = 0;
          iVar10 = iVar5;
          do {
            iVar5 = piVar3[uVar11 + uVar14 + 1];
            uVar16 = iVar10 - iVar5;
            if (iVar10 < iVar5) {
              uVar16 = iVar5 - iVar10;
              if ((int)uVar16 < 0) goto LAB_0064b74e;
              uVar9 = (ulong)(uVar16 * 2 + 1);
              if (0x3f < uVar16) {
                pbVar17 = puVar4 + iVar7;
                do {
                  uVar16 = (uint)uVar9;
                  *pbVar17 = (byte)uVar9 | 0x80;
                  uVar9 = uVar9 >> 7;
                  pbVar17 = pbVar17 + 1;
                  iVar7 = iVar7 + 1;
                } while (0x3fff < uVar16);
              }
            }
            else {
              if ((int)uVar16 < 0) goto LAB_0064b74e;
              uVar9 = (ulong)(uVar16 * 2);
              if (0x3f < uVar16) {
                pbVar17 = puVar4 + iVar7;
                do {
                  uVar16 = (uint)uVar9;
                  *pbVar17 = (byte)uVar9 | 0x80;
                  uVar9 = uVar9 >> 7;
                  pbVar17 = pbVar17 + 1;
                  iVar7 = iVar7 + 1;
                } while (0x3fff < uVar16);
              }
            }
            puVar4[iVar7] = (uchar)uVar9;
            uVar14 = uVar14 + 1;
            iVar7 = iVar7 + 1;
            iVar10 = iVar5;
          } while (uVar14 != uVar13);
        }
        iVar10 = (int)uVar12;
        if ((long)iVar5 < (long)uVar12) {
          uVar16 = iVar10 - iVar5;
          if ((int)uVar16 < 0) {
LAB_0064b74e:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          uVar11 = (ulong)(uVar16 * 2 + 1);
          if (0x3f < uVar16) {
            pbVar17 = puVar4 + iVar7;
            do {
              uVar16 = (uint)uVar11;
              *pbVar17 = (byte)uVar11 | 0x80;
              uVar11 = uVar11 >> 7;
              pbVar17 = pbVar17 + 1;
              iVar7 = iVar7 + 1;
            } while (0x3fff < uVar16);
          }
        }
        else {
          uVar16 = iVar5 - iVar10;
          if ((int)uVar16 < 0) goto LAB_0064b74e;
          uVar11 = (ulong)(uVar16 * 2);
          if (0x3f < uVar16) {
            pbVar17 = puVar4 + iVar7;
            do {
              uVar16 = (uint)uVar11;
              *pbVar17 = (byte)uVar11 | 0x80;
              uVar11 = uVar11 >> 7;
              pbVar17 = pbVar17 + 1;
              iVar7 = iVar7 + 1;
            } while (0x3fff < uVar16);
          }
        }
        puVar4[iVar7] = (uchar)uVar11;
        iVar7 = iVar7 + 1;
        iVar5 = iVar10;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar18);
  }
  iVar5 = 0x18;
  puVar8 = puVar4;
  do {
    *puVar8 = (uchar)(iVar7 >> ((byte)iVar5 & 0x1f));
    puVar8 = puVar8 + 1;
    iVar5 = iVar5 + -8;
  } while (iVar5 != -8);
  *pMapSize = iVar7;
  return puVar4;
}

Assistant:

unsigned char * Gia_AigerWriteMappingInt( Gia_Man_t * p, int * pMapSize )
{
    unsigned char * pBuffer;
    int i, k, iPrev, iFan, nItems, iPos = 4;
    assert( Gia_ManHasMapping(p) );
    // count the number of entries to be written
    nItems = 0;
    Gia_ManForEachLut( p, i )
        nItems += 2 + Gia_ObjLutSize( p, i );
    pBuffer = ABC_ALLOC( unsigned char, sizeof(int) * (nItems + 1) );
    // write non-constant classes
    iPrev = 0;
    Gia_ManForEachLut( p, i )
    {
//printf( "\nSize = %d ", Gia_ObjLutSize(p, i) );
        iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
        {
//printf( "Fan = %d ", iFan );
            iPos = Gia_AigerWriteDiffValue( pBuffer, iPos, iPrev, iFan );
            iPrev = iFan;
        }
        iPos = Gia_AigerWriteDiffValue( pBuffer, iPos, iPrev, i );
        iPrev = i;
//printf( "Node = %d ", i );
    }
//printf( "\n" );
    Gia_AigerWriteInt( pBuffer, iPos );
    *pMapSize = iPos;
    return pBuffer;
}